

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void sse::ProjectionProfile
               (uint32_t rowSize,uint8_t *imageStart,uint32_t height,bool horizontal,uint32_t *out,
               uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined7 in_register_00000009;
  uint8_t *puVar1;
  uint32_t uVar2;
  long lVar3;
  int iVar4;
  uint8_t *puVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  
  auVar7 = _DAT_001e5580;
  if ((int)CONCAT71(in_register_00000009,horizontal) == 0) {
    if (height * rowSize != 0) {
      puVar1 = imageStart + height * rowSize;
      puVar5 = imageStart + totalSimdWidth;
      do {
        auVar9 = ZEXT1664((undefined1  [16])0x0);
        auVar7 = (undefined1  [16])0x0;
        if (simdWidth != 0) {
          lVar3 = 0;
          do {
            auVar7 = vpmovzxbw_avx(*(undefined1 (*) [16])(imageStart + lVar3));
            auVar12 = vpunpckhbw_avx(*(undefined1 (*) [16])(imageStart + lVar3),
                                     (undefined1  [16])0x0);
            auVar7 = vpaddw_avx(auVar7,auVar12);
            auVar12 = vpmovzxwd_avx(auVar7);
            auVar7 = vpunpckhwd_avx(auVar7,(undefined1  [16])0x0);
            auVar7 = vpaddd_avx(auVar9._0_16_,auVar7);
            auVar7 = vpaddd_avx(auVar7,auVar12);
            auVar9 = ZEXT1664(auVar7);
            lVar3 = lVar3 + 0x10;
          } while ((ulong)simdWidth << 4 != lVar3);
        }
        if (nonSimdWidth != 0) {
          uVar2 = *out;
          uVar6 = 0;
          do {
            uVar2 = uVar2 + puVar5[uVar6];
            *out = uVar2;
            uVar6 = uVar6 + 1;
          } while (nonSimdWidth != uVar6);
        }
        auVar7 = vphaddd_avx(auVar7,auVar7);
        auVar7 = vphaddd_avx(auVar7,auVar7);
        *out = *out + auVar7._0_4_;
        imageStart = imageStart + rowSize;
        out = out + 1;
        puVar5 = puVar5 + rowSize;
      } while (imageStart != puVar1);
    }
  }
  else {
    if (totalSimdWidth != 0) {
      puVar1 = imageStart + totalSimdWidth;
      do {
        auVar9 = ZEXT1664((undefined1  [16])0x0);
        auVar8 = (undefined1  [16])0x0;
        auVar11 = ZEXT1664((undefined1  [16])0x0);
        auVar10 = (undefined1  [16])0x0;
        auVar15 = ZEXT1664((undefined1  [16])0x0);
        auVar14 = (undefined1  [16])0x0;
        auVar13 = ZEXT1664((undefined1  [16])0x0);
        auVar12 = (undefined1  [16])0x0;
        if ((ulong)(height * rowSize) != 0) {
          uVar6 = 0;
          do {
            auVar14 = *(undefined1 (*) [16])(imageStart + uVar6);
            auVar8 = vpunpckhbw_avx(auVar14,(undefined1  [16])0x0);
            auVar12 = vpmovzxbd_avx(auVar14);
            auVar12 = vpaddd_avx(auVar12,auVar13._0_16_);
            auVar13 = ZEXT1664(auVar12);
            auVar14 = vpshufb_avx(auVar14,auVar7);
            auVar14 = vpaddd_avx(auVar15._0_16_,auVar14);
            auVar15 = ZEXT1664(auVar14);
            auVar10 = vpmovzxwd_avx(auVar8);
            auVar10 = vpaddd_avx(auVar11._0_16_,auVar10);
            auVar11 = ZEXT1664(auVar10);
            auVar8 = vpunpckhwd_avx(auVar8,(undefined1  [16])0x0);
            auVar8 = vpaddd_avx(auVar9._0_16_,auVar8);
            auVar9 = ZEXT1664(auVar8);
            uVar6 = uVar6 + rowSize;
          } while (height * rowSize != uVar6);
        }
        auVar12 = vpaddd_avx(auVar12,*(undefined1 (*) [16])out);
        *(undefined1 (*) [16])out = auVar12;
        auVar12 = vpaddd_avx(auVar14,*(undefined1 (*) [16])((long)out + 0x10));
        *(undefined1 (*) [16])((long)out + 0x10) = auVar12;
        auVar12 = vpaddd_avx(auVar10,*(undefined1 (*) [16])((long)out + 0x20));
        *(undefined1 (*) [16])((long)out + 0x20) = auVar12;
        auVar12 = vpaddd_avx(auVar8,*(undefined1 (*) [16])((long)out + 0x30));
        *(undefined1 (*) [16])((long)out + 0x30) = auVar12;
        imageStart = imageStart + 0x10;
        out = (uint32_t *)((long)out + 0x40);
      } while (imageStart != puVar1);
    }
    if (nonSimdWidth != 0) {
      puVar1 = imageStart + nonSimdWidth;
      do {
        if ((ulong)(height * rowSize) != 0) {
          iVar4 = *(int *)*(undefined1 (*) [16])out;
          uVar6 = 0;
          do {
            iVar4 = iVar4 + (uint)imageStart[uVar6];
            *(int *)*(undefined1 (*) [16])out = iVar4;
            uVar6 = uVar6 + rowSize;
          } while (height * rowSize != uVar6);
        }
        imageStart = imageStart + 1;
        out = (uint32_t *)(*(undefined1 (*) [16])out + 4);
      } while (imageStart != puVar1);
    }
  }
  return;
}

Assistant:

void ProjectionProfile( uint32_t rowSize, const uint8_t * imageStart, uint32_t height, bool horizontal,
                            uint32_t * out, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd zero = _mm_setzero_si128();

        if( horizontal ) {
            const uint8_t * imageSimdXEnd = imageStart + totalSimdWidth;

            for( ; imageStart != imageSimdXEnd; imageStart += simdSize, out += simdSize ) {
                const uint8_t * imageSimdY    = imageStart;
                const uint8_t * imageSimdYEnd = imageSimdY + height * rowSize;
                simd simdSum_1 = _mm_setzero_si128();
                simd simdSum_2 = _mm_setzero_si128();
                simd simdSum_3 = _mm_setzero_si128();
                simd simdSum_4 = _mm_setzero_si128();

                simd * dst = reinterpret_cast <simd*> (out);

                for( ; imageSimdY != imageSimdYEnd; imageSimdY += rowSize) {
                    const simd * src    = reinterpret_cast <const simd*> (imageSimdY);

                    const simd data = _mm_loadu_si128( src );

                    const simd dataLo  = _mm_unpacklo_epi8( data, zero );
                    const simd dataHi  = _mm_unpackhi_epi8( data, zero );

                    const simd data_1 = _mm_unpacklo_epi16( dataLo, zero );
                    const simd data_2 = _mm_unpackhi_epi16( dataLo, zero );
                    const simd data_3 = _mm_unpacklo_epi16( dataHi, zero );
                    const simd data_4 = _mm_unpackhi_epi16( dataHi, zero );
                    simdSum_1 = _mm_add_epi32( data_1, simdSum_1 );
                    simdSum_2 = _mm_add_epi32( data_2, simdSum_2 );
                    simdSum_3 = _mm_add_epi32( data_3, simdSum_3 );
                    simdSum_4 = _mm_add_epi32( data_4, simdSum_4 );
                }

                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_1, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_2, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_3, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_4, _mm_loadu_si128( dst ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageXEnd = imageStart + nonSimdWidth;

                for( ; imageStart != imageXEnd; ++imageStart, ++out ) {
                    const uint8_t * imageY    = imageStart;
                    const uint8_t * imageYEnd = imageY + height * rowSize;

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*out) += (*imageY);
                }
            }
        }
        else {
            const uint8_t * imageYEnd = imageStart + height * rowSize;

            for( ; imageStart != imageYEnd; imageStart += rowSize, ++out ) {
                const simd * src    = reinterpret_cast <const simd*> (imageStart);
                const simd * srcEnd = src + simdWidth;
                simd simdSum = _mm_setzero_si128();

                for( ; src != srcEnd; ++src ) {
                    simd data = _mm_loadu_si128( src );

                    simd dataLo  = _mm_unpacklo_epi8( data, zero );
                    simd dataHi  = _mm_unpackhi_epi8( data, zero );
                    simd sumLoHi = _mm_add_epi16( dataLo, dataHi );

                    simdSum = _mm_add_epi32( simdSum, _mm_add_epi32( _mm_unpacklo_epi16( sumLoHi, zero ),
                                                                     _mm_unpackhi_epi16( sumLoHi, zero ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * imageX    = imageStart + totalSimdWidth;
                    const uint8_t * imageXEnd = imageX + nonSimdWidth;

                    for( ; imageX != imageXEnd; ++imageX )
                        (*out) += (*imageX);
                }

                uint32_t output[4] = { 0 };
                _mm_storeu_si128( reinterpret_cast <simd*>(output), simdSum );
                
                (*out) += output[0] + output[1] + output[2] + output[3];
            }
        }
    }